

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O0

void * uo_cb_execute(void *thrd_i)

{
  uo_cb *cb_00;
  size_t count_target;
  size_t count;
  uo_cb *cb;
  void *thrd_i_local;
  
  uo_cb_thrd_init();
  do {
    if (((is_quitting ^ 0xffU) & 1) == 0) goto LAB_0010d217;
    cb_00 = uo_cb_queue_try_dequeue();
    if (cb_00 != (uo_cb *)0x0) {
      uo_cb_thrdpool_notify_before_invoke();
      uo_cb_invoke(cb_00);
      uo_cb_thrdpool_notify_after_invoke();
    }
  } while (thrdpool.thrd_count <= thrdpool.thrd_count_target);
  thrdpool.thrd_count = thrdpool.thrd_count - 1;
  LOCK();
  UNLOCK();
LAB_0010d217:
  uo_cb_thrd_quit();
  thrdpool.cb_thrds[(long)thrd_i].state = UO_CB_THRD_EXITED;
  return thrd_i_local;
}

Assistant:

static void *uo_cb_execute(
    void *thrd_i)
{
    uo_cb_thrd_init();

    while (!is_quitting)
    {
        uo_cb *cb = uo_cb_queue_try_dequeue();

        if (cb)
        {
            uo_cb_thrdpool_notify_before_invoke();
            uo_cb_invoke(cb);
            uo_cb_thrdpool_notify_after_invoke();
        }

        size_t count = atomic_load(&thrdpool.thrd_count);
        size_t count_target = thrdpool.thrd_count_target;

        if (count > count_target && atomic_compare_exchange_strong(&thrdpool.thrd_count, &count, count - 1))
            break;
    }

    uo_cb_thrd_quit();

    thrdpool.cb_thrds[(size_t)thrd_i].state = UO_CB_THRD_EXITED;
}